

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_send(connectdata *conn,ssize_t len,size_t upload_size)

{
  CURLcode CVar1;
  ssize_t bytes_written;
  long local_20;
  
  CVar1 = Curl_write(conn,0,(conn->data->state).uploadbuffer,len,&local_20);
  if (CVar1 == CURLE_OK) {
    if (local_20 != len) {
      (conn->proto).smbc.send_size = len;
      (conn->proto).ftpc.pp.response.tv_sec = local_20;
    }
    (conn->proto).smbc.upload_size = upload_size;
  }
  return CVar1;
}

Assistant:

static CURLcode smb_send(struct connectdata *conn, ssize_t len,
                         size_t upload_size)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  ssize_t bytes_written;
  CURLcode result;

  result = Curl_write(conn, FIRSTSOCKET, conn->data->state.uploadbuffer,
                      len, &bytes_written);
  if(result)
    return result;

  if(bytes_written != len) {
    smbc->send_size = len;
    smbc->sent = bytes_written;
  }

  smbc->upload_size = upload_size;

  return CURLE_OK;
}